

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# er.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  size_t sVar7;
  time_t tVar8;
  ostream *poVar9;
  undefined8 extraout_RAX;
  int iVar10;
  ostream *this;
  double dVar11;
  ofstream file_stream;
  int local_25c;
  float local_258;
  allocator local_251;
  char *local_250;
  int local_244;
  ulong local_240;
  double local_238;
  long *local_230;
  filebuf local_228 [8];
  long local_220 [2];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  if (0 < argc) {
    local_25c = -1;
    local_258 = 1.0;
    local_250 = (char *)0x0;
    iVar10 = 0;
    local_240 = 0;
    bVar2 = false;
    do {
      std::__cxx11::string::string((string *)&local_230,argv[iVar10],&local_251);
      iVar4 = std::__cxx11::string::compare((char *)&local_230);
      if (iVar4 == 0) {
        print_usage_and_exit(0);
        goto LAB_001029a4;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_230);
      if (iVar4 == 0) {
        dVar11 = atof(argv[(long)iVar10 + 1]);
        local_258 = (float)dVar11;
        iVar10 = iVar10 + 1;
        pcVar3 = local_250;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_230);
        if (iVar4 == 0) {
          bVar2 = true;
          pcVar3 = local_250;
        }
        else {
          uVar6 = std::__cxx11::string::compare((char *)&local_230);
          if ((int)uVar6 == 0) {
            local_240 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
            pcVar3 = local_250;
          }
          else {
            pcVar3 = argv[iVar10];
            if (local_25c < 0) {
              local_25c = atoi(argv[iVar10]);
              pcVar3 = local_250;
            }
          }
        }
      }
      local_250 = pcVar3;
      if (local_230 != local_220) {
        operator_delete(local_230,local_220[0] + 1);
      }
      pcVar3 = local_250;
      iVar10 = iVar10 + 1;
    } while (iVar10 < argc);
    if (local_25c != -1) {
      this = (ostream *)&local_230;
      std::ofstream::ofstream(this,local_250,_S_out);
      if (pcVar3 == (char *)0x0) {
        this = (ostream *)&std::cout;
      }
      else if ((abStack_210[local_230[-3]] & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"couldn\'t open file ",0x13);
        pcVar3 = local_250;
        sVar7 = strlen(local_250);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar7);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        exit(-1);
      }
      tVar8 = time((time_t *)0x0);
      srand((uint)tVar8);
      std::__ostream_insert<char,std::char_traits<char>>(this,"dim 0",5);
      cVar1 = (char)this;
      std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      iVar10 = local_25c;
      if (0 < local_25c) {
        do {
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)this,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(this,"dim 1",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      if (0 < local_25c) {
        local_238 = (double)local_258;
        iVar10 = 0;
        do {
          iVar4 = iVar10 + 1;
          local_244 = iVar4;
          if (iVar4 < local_25c) {
            do {
              if (((local_258 == 1.0) && (!NAN(local_258))) ||
                 (iVar5 = rand(), (double)(iVar5 % 1000) / 1000.0 < local_238)) {
                poVar9 = (ostream *)std::ostream::operator<<((ostream *)this,iVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                std::ostream::operator<<((ostream *)poVar9,iVar4);
                if (bVar2) {
                  std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
                  iVar5 = rand();
                  std::ostream::_M_insert<double>((double)(iVar5 % 100) / 100.0 + 1.0);
                }
                std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1);
                std::ostream::put(cVar1);
                std::ostream::flush();
                if ((local_240 & 1) == 0) {
                  if ((local_258 != 1.0) || (NAN(local_258))) goto LAB_001027bd;
LAB_001027ff:
                  poVar9 = (ostream *)std::ostream::operator<<((ostream *)this,iVar4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                  std::ostream::operator<<((ostream *)poVar9,iVar10);
                  if (bVar2) {
                    std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
                    iVar5 = rand();
                    std::ostream::_M_insert<double>((double)(iVar5 % 100) / 100.0 + 1.0);
                  }
                  std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1);
                  std::ostream::put(cVar1);
                  std::ostream::flush();
                }
              }
              else if ((local_240 & 1) == 0) {
LAB_001027bd:
                iVar5 = rand();
                if ((double)(iVar5 % 1000) / 1000.0 < local_238) goto LAB_001027ff;
              }
              iVar4 = iVar4 + 1;
            } while (local_25c != iVar4);
          }
          iVar10 = local_244;
        } while (local_244 != local_25c);
      }
      if (local_250 != (char *)0x0) {
        std::ofstream::close();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Wrote directed graph to ",0x18);
        pcVar3 = local_250;
        sVar7 = strlen(local_250);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
      local_230 = _VTT;
      *(undefined8 *)(local_228 + _VTT[-3] + -8) = _time;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      return 0;
    }
  }
LAB_001029a4:
  print_usage_and_exit(-1);
  std::ofstream::~ofstream(&local_230);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char** argv) {

	const char* filename = nullptr;
	int n = -1;
	float density = 1.0;
	bool edge_filtration = false;
	bool undirected = false;

	for (int i = 0; i < argc; ++i) {
		const std::string arg(argv[i]);
		if (arg == "--help") {
			print_usage_and_exit(0);
		} else if (arg == "--density") {
			density = float(atof(argv[++i]));
		} else if (arg == "--random-edge-filtration") {
			edge_filtration = true;
		} else if (arg == "--undirected") {
			undirected = true;
		} else {
			if (n > -1) {
				filename = argv[i];
			} else
				n = atoi(argv[i]);
		}
	}

	if (n == -1) { print_usage_and_exit(-1); }

	std::ofstream file_stream(filename);
	if (filename && file_stream.fail()) {
		std::cerr << "couldn't open file " << filename << std::endl;
		exit(-1);
	}

	srand((unsigned int)time(NULL));
	std::ostream& output_stream = filename ? file_stream : std::cout;
	output_stream << "dim 0" << std::endl;
	for (int i = 0; i < n; i++) output_stream << 0 << " ";
	output_stream << std::endl;

	output_stream << "dim 1" << std::endl;
	for (int i = 0; i < n; i++) {
		for (int j = i + 1; j < n; j++) {
			if (density == 1 || (rand() % 1000) / 1000.0 < density) {
				output_stream << i << " " << j;
				if (edge_filtration) output_stream << " " << (1 + (rand() % 100) / 100.0);
				output_stream << std::endl;
			}

			if (undirected) continue;

			if (density == 1 || (rand() % 1000) / 1000.0 < density) {
				output_stream << j << " " << i;
				if (edge_filtration) output_stream << " " << (1 + (rand() % 100) / 100.0);
				output_stream << std::endl;
			}
		}
	}

	if (filename) {
		file_stream.close();
		std::cout << "Wrote directed graph to " << filename << "." << std::endl;
	}
}